

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_Normal(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement_Normal *pCVar7;
  allocator local_d1;
  string local_d0;
  undefined4 local_b0;
  allocator local_a9;
  undefined1 local_a8 [8];
  string an;
  uint local_74;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vector;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &vector.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::list
            ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
  local_74 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_74 < iVar2; local_74 = local_74 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_74);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,(char *)CONCAT44(extraout_var,iVar3),&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_74);
      std::__cxx11::string::operator=
                ((string *)
                 &vector.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node._M_size,(char *)CONCAT44(extraout_var_00,iVar3));
      local_b0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_74);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_b0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,"bboxCenter");
        if (bVar1) {
          local_b0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8,"bboxSize");
          if (bVar1) {
            local_b0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"containerField");
            if (bVar1) {
              local_b0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a8,"vector");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsListVec3f
                          (this,local_74,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
                local_b0 = 4;
              }
              else {
                Throw_IncorrectAttr(this,(string *)local_a8);
                local_b0 = 0;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Normal,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar7 = (CX3DImporter_NodeElement_Normal *)operator_new(0x68);
    CX3DImporter_NodeElement_Normal::CX3DImporter_NodeElement_Normal(pCVar7,this->NodeElement_Cur);
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)
                 &vector.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node._M_size);
    }
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
              (&_idx_end->Value,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne)
    ;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"Normal",&local_d1);
      ParseNode_Metadata(this,&pCVar7->super_CX3DImporter_NodeElement,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~list
            ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
  std::__cxx11::string::~string
            ((string *)
             &vector.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_Normal()
{
std::string use, def;
std::list<aiVector3D> vector;
CX3DImporter_NodeElement* ne;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("vector", vector, XML_ReadNode_GetAttrVal_AsListVec3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Normal, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Normal(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Normal*)ne)->Value = vector;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Normal");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}